

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O1

void tandem::detail::add_maximal_periodicities<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
               LZBlock *prev_block,LZBlock *block,uint32_t min_period,uint32_t max_period,
               LMRVector *result)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  int iVar4;
  pointer pcVar5;
  pointer pcVar6;
  ulong uVar7;
  pointer pcVar8;
  pointer pcVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint local_6c;
  uint local_68;
  uint local_64;
  long local_60;
  ulong local_58;
  ulong local_50;
  uint local_44;
  deque<tandem::Repeat,std::allocator<tandem::Repeat>> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  uVar1 = block->pos;
  uVar14 = (ulong)uVar1;
  uVar2 = block->length;
  local_44 = uVar2 + prev_block->length * 2;
  if (uVar1 <= local_44) {
    local_44 = uVar1;
  }
  local_60 = CONCAT44(local_60._4_4_,max_period);
  if (uVar2 < max_period) {
    max_period = uVar2;
  }
  uVar7 = (ulong)(uVar1 - local_44);
  local_50 = (ulong)(uVar2 + uVar1);
  local_40 = (deque<tandem::Repeat,std::allocator<tandem::Repeat>> *)result;
  local_38 = str;
  if (min_period <= max_period) {
    local_58 = (ulong)(uVar1 - 1);
    uVar15 = ~local_58;
    local_6c = min_period;
    do {
      uVar10 = local_6c + uVar1;
      pcVar3 = (local_38->_M_dataplus)._M_p;
      pcVar5 = pcVar3 + local_58 + 1;
      pcVar6 = pcVar5;
      if (pcVar5 != pcVar3 + uVar7) {
        lVar13 = 0;
        pcVar8 = pcVar5;
        do {
          pcVar6 = pcVar8;
          if (pcVar8[-1] != pcVar3[lVar13 + (ulong)(uVar10 - 1)]) break;
          pcVar8 = pcVar8 + -1;
          lVar13 = lVar13 + -1;
          pcVar6 = pcVar3 + uVar7;
        } while (uVar15 + uVar7 != lVar13);
      }
      pcVar8 = pcVar3 + uVar10;
      pcVar9 = pcVar8;
      if (local_6c != uVar2) {
        pcVar9 = pcVar3 + local_50;
        lVar13 = 0;
        do {
          if (pcVar8[lVar13] != pcVar3[lVar13 + uVar14]) {
            pcVar9 = pcVar8 + lVar13;
            break;
          }
          lVar13 = lVar13 + 1;
        } while (local_50 - uVar10 != lVar13);
      }
      iVar4 = (int)pcVar5 - (int)pcVar6;
      iVar11 = (int)pcVar9 - (int)pcVar8;
      if ((local_6c <= (uint)(iVar11 + iVar4)) && (local_68 = local_6c + iVar11, local_68 < uVar2))
      {
        local_64 = uVar1 - iVar4;
        local_68 = local_68 + iVar4;
        std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
        emplace_back<unsigned_int,unsigned_int,unsigned_int&>
                  (local_40,&local_64,&local_68,&local_6c);
      }
      local_6c = local_6c + 1;
    } while (local_6c <= max_period);
  }
  uVar10 = (uint)local_60;
  if (local_44 < (uint)local_60) {
    uVar10 = local_44;
  }
  if (min_period < uVar10) {
    local_58 = (ulong)(uVar1 - 1);
    local_60 = uVar7 - 1;
    lVar13 = local_50 - uVar14;
    local_6c = min_period;
    do {
      pcVar3 = (local_38->_M_dataplus)._M_p;
      pcVar5 = pcVar3 + (ulong)(~local_6c + uVar1) + 1;
      pcVar6 = pcVar5;
      if (pcVar5 != pcVar3 + uVar7) {
        lVar12 = 0;
        pcVar8 = pcVar5;
        do {
          pcVar6 = pcVar8;
          if (pcVar8[-1] != pcVar3[lVar12 + local_58]) break;
          pcVar8 = pcVar8 + -1;
          lVar12 = lVar12 + -1;
          pcVar6 = pcVar3 + uVar7;
        } while (local_60 - (ulong)(~local_6c + uVar1) != lVar12);
      }
      pcVar8 = pcVar3 + uVar14;
      pcVar9 = pcVar8;
      if (uVar2 != 0) {
        pcVar9 = pcVar3 + local_50;
        lVar12 = 0;
        do {
          if (pcVar8[lVar12] != pcVar3[lVar12 + (ulong)(uVar1 - local_6c)]) {
            pcVar9 = pcVar8 + lVar12;
            break;
          }
          lVar12 = lVar12 + 1;
        } while (lVar13 != lVar12);
      }
      iVar4 = (int)pcVar5 - (int)pcVar6;
      iVar11 = (int)pcVar9 - (int)pcVar8;
      if (local_6c <= (uint)(iVar11 + iVar4)) {
        iVar4 = local_6c + iVar4;
        local_64 = uVar1 - iVar4;
        local_68 = iVar4 + iVar11;
        std::deque<tandem::Repeat,std::allocator<tandem::Repeat>>::
        emplace_back<unsigned_int,unsigned_int,unsigned_int&>
                  (local_40,&local_64,&local_68,&local_6c);
      }
      local_6c = local_6c + 1;
    } while (local_6c < uVar10);
  }
  return;
}

Assistant:

void add_maximal_periodicities(const T& str, const LZBlock& prev_block, const LZBlock& block,
                               const std::uint32_t min_period, const std::uint32_t max_period,
                               LMRVector& result)
{
    const auto u   = block.pos;
    const auto n   = block.length;
    const auto m   = std::min(u, 2 * prev_block.length + n);
    const auto t   = u - m;
    const auto end = u + n;
    // rightmax periodicities
    for (auto j = min_period; j <= std::min(n, max_period); ++j) {
        const auto ls = backward_lce(str, u - 1, u + j - 1, t);
        const auto lp = forward_lce(str, u + j, u, end);
        if (ls + lp >= j && j + lp < n) {
            result.emplace_back(u - ls, j + lp + ls, j);
        }
    }
    // leftmax periodicities
    for (auto j = min_period; j < std::min(m, max_period); ++j) {
        const auto ls = backward_lce(str, u - j - 1, u - 1, t);
        const auto lp = forward_lce(str, u, u - j, end);
        if (ls + lp >= j) {
            result.emplace_back(u - (ls + j), j + lp + ls, j);
        }
    }
}